

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

int language::formatSpecialCharacter(QTextStream *str,ushort value)

{
  short in_SI;
  QTextStream *in_RDI;
  int length;
  int local_10;
  
  local_10 = 0;
  if (in_SI == 10) {
    QTextStream::operator<<(in_RDI,"\\n\"\n\"");
    local_10 = 5;
  }
  else if (in_SI == 0x22) {
    QTextStream::operator<<(in_RDI,"\\\"");
    local_10 = 2;
  }
  else if (in_SI == 0x5c) {
    QTextStream::operator<<(in_RDI,"\\\\");
    local_10 = 2;
  }
  return local_10;
}

Assistant:

static int formatSpecialCharacter(QTextStream &str, ushort value)
{
    int length = 0;
    switch (value) {
    case '\\':
        str << "\\\\";
        length += 2;
        break;
    case '\"':
        str << "\\\"";
        length += 2;
        break;
    case '\n':
        str << "\\n\"\n\"";
        length += 5;
        break;
    default:
        break;
    }
    return length;
}